

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

uint8_t add8_sat(uint8_t a,uint8_t b)

{
  byte bVar1;
  byte bVar2;
  
  bVar2 = b + a;
  bVar1 = 0x7f - ((char)a >> 7);
  if (-1 < (char)(bVar2 ^ a)) {
    bVar1 = bVar2;
  }
  if ((char)(b ^ a) < '\0') {
    bVar1 = bVar2;
  }
  return bVar1;
}

Assistant:

static inline uint8_t add8_sat(uint8_t a, uint8_t b)
{
    uint8_t res;

    res = a + b;
    if (((res ^ a) & 0x80) && !((a ^ b) & 0x80)) {
        if (a & 0x80)
            res = 0x80;
        else
            res = 0x7f;
    }
    return res;
}